

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall
cimg_library::CImg<unsigned_char>::CImg
          (CImg<unsigned_char> *this,uchar *values,uint size_x,uint size_y,uint size_z,uint size_c,
          bool is_shared)

{
  uchar *__dest;
  ulong __n;
  
  __n = (ulong)size_c * (ulong)size_z * (ulong)size_y * (ulong)size_x;
  if (__n == 0 || values == (uchar *)0x0) {
    this->_data = (uchar *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  else {
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
    this->_is_shared = is_shared;
    if (!is_shared) {
      __dest = (uchar *)operator_new__(__n);
      this->_data = __dest;
      memcpy(__dest,values,__n);
      return;
    }
    this->_data = values;
  }
  return;
}

Assistant:

CImg(const T *const values, const unsigned int size_x, const unsigned int size_y=1,
         const unsigned int size_z=1, const unsigned int size_c=1, const bool is_shared=false) {
      const unsigned long siz = (unsigned long)size_x*size_y*size_z*size_c;
      if (values && siz) {
        _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c; _is_shared = is_shared;
        if (_is_shared) _data = const_cast<T*>(values);
        else {
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),size_x,size_y,size_z,size_c);
          }
          std::memcpy(_data,values,siz*sizeof(T)); }
      } else { _width = _height = _depth = _spectrum = 0; _is_shared = false; _data = 0; }
    }